

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageProcessing2QCOMWindowDecoration
          (ValidationState_t *_,int id)

{
  bool bVar1;
  Op OVar2;
  DiagnosticStream *pDVar3;
  string local_dd8;
  DiagnosticStream local_db8;
  uint32_t local_bdc;
  undefined1 local_bd8 [4];
  int sampler_id;
  Instruction *local_a00;
  Instruction *s_ld_inst;
  undefined1 local_9f0 [4];
  int s_idx;
  DiagnosticStream local_9d0;
  Decoration local_7f8;
  uint32_t local_7f4;
  Decoration decor_1;
  int texture_id_1;
  Instruction *local_618;
  Instruction *t_ld_inst;
  Instruction *pIStack_608;
  int t_idx;
  Instruction *si_inst;
  DiagnosticStream local_5e0;
  string local_408;
  DiagnosticStream local_3e8;
  Decoration local_210;
  uint32_t local_20c;
  Decoration decor;
  int texture_id;
  undefined1 local_29;
  Instruction *pIStack_28;
  bool is_intf_obj;
  Instruction *ld_inst;
  ValidationState_t *pVStack_18;
  int id_local;
  ValidationState_t *__local;
  
  ld_inst._4_4_ = id;
  pVStack_18 = _;
  pIStack_28 = ValidationState_t::FindDef(_,id);
  OVar2 = Instruction::opcode(pIStack_28);
  local_29 = OVar2 != OpSampledImage;
  if ((bool)local_29) {
    OVar2 = Instruction::opcode(pIStack_28);
    if (OVar2 != OpLoad) {
      ValidationState_t::diag
                ((DiagnosticStream *)&decor,pVStack_18,SPV_ERROR_INVALID_DATA,pIStack_28);
      pDVar3 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&decor,(char (*) [21])"Expect to see OpLoad");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decor);
      return __local._4_4_;
    }
    local_20c = Instruction::GetOperandAs<int>(pIStack_28,2);
    local_210 = BlockMatchTextureQCOM;
    bVar1 = ValidationState_t::HasDecoration(pVStack_18,local_20c,BlockMatchTextureQCOM);
    if (!bVar1) {
      ValidationState_t::diag(&local_3e8,pVStack_18,SPV_ERROR_INVALID_DATA,pIStack_28);
      pDVar3 = DiagnosticStream::operator<<(&local_3e8,(char (*) [20])"Missing decoration ");
      ValidationState_t::SpvDecorationString_abi_cxx11_(&local_408,pVStack_18,local_210);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_408);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&local_408);
      DiagnosticStream::~DiagnosticStream(&local_3e8);
      return __local._4_4_;
    }
    local_210 = BlockMatchSamplerQCOM;
    bVar1 = ValidationState_t::HasDecoration(pVStack_18,local_20c,BlockMatchSamplerQCOM);
    if (!bVar1) {
      ValidationState_t::diag(&local_5e0,pVStack_18,SPV_ERROR_INVALID_DATA,pIStack_28);
      pDVar3 = DiagnosticStream::operator<<(&local_5e0,(char (*) [20])"Missing decoration ");
      ValidationState_t::SpvDecorationString_abi_cxx11_((string *)&si_inst,pVStack_18,local_210);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&si_inst);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&si_inst);
      DiagnosticStream::~DiagnosticStream(&local_5e0);
      return __local._4_4_;
    }
  }
  else {
    pIStack_608 = pIStack_28;
    t_ld_inst._4_4_ = Instruction::GetOperandAs<int>(pIStack_28,2);
    local_618 = ValidationState_t::FindDef(pVStack_18,t_ld_inst._4_4_);
    OVar2 = Instruction::opcode(local_618);
    if (OVar2 != OpLoad) {
      ValidationState_t::diag
                ((DiagnosticStream *)&decor_1,pVStack_18,SPV_ERROR_INVALID_DATA,local_618);
      pDVar3 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&decor_1,(char (*) [21])"Expect to see OpLoad");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decor_1);
      return __local._4_4_;
    }
    local_7f4 = Instruction::GetOperandAs<int>(local_618,2);
    local_7f8 = BlockMatchTextureQCOM;
    bVar1 = ValidationState_t::HasDecoration(pVStack_18,local_7f4,BlockMatchTextureQCOM);
    if (!bVar1) {
      ValidationState_t::diag(&local_9d0,pVStack_18,SPV_ERROR_INVALID_DATA,pIStack_28);
      pDVar3 = DiagnosticStream::operator<<(&local_9d0,(char (*) [20])"Missing decoration ");
      ValidationState_t::SpvDecorationString_abi_cxx11_((string *)local_9f0,pVStack_18,local_7f8);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_9f0);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)local_9f0);
      DiagnosticStream::~DiagnosticStream(&local_9d0);
      return __local._4_4_;
    }
    s_ld_inst._4_4_ = Instruction::GetOperandAs<int>(pIStack_608,3);
    local_a00 = ValidationState_t::FindDef(pVStack_18,s_ld_inst._4_4_);
    OVar2 = Instruction::opcode(local_a00);
    if (OVar2 != OpLoad) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_bd8,pVStack_18,SPV_ERROR_INVALID_DATA,local_a00);
      pDVar3 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_bd8,(char (*) [21])"Expect to see OpLoad");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_bd8);
      return __local._4_4_;
    }
    local_bdc = Instruction::GetOperandAs<int>(local_a00,2);
    local_7f8 = BlockMatchSamplerQCOM;
    bVar1 = ValidationState_t::HasDecoration(pVStack_18,local_bdc,BlockMatchSamplerQCOM);
    if (!bVar1) {
      ValidationState_t::diag(&local_db8,pVStack_18,SPV_ERROR_INVALID_DATA,pIStack_28);
      pDVar3 = DiagnosticStream::operator<<(&local_db8,(char (*) [20])"Missing decoration ");
      ValidationState_t::SpvDecorationString_abi_cxx11_(&local_dd8,pVStack_18,local_7f8);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_dd8);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&local_dd8);
      DiagnosticStream::~DiagnosticStream(&local_db8);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateImageProcessing2QCOMWindowDecoration(ValidationState_t& _,
                                                          int id) {
  const Instruction* ld_inst = _.FindDef(id);
  bool is_intf_obj = (ld_inst->opcode() != spv::Op::OpSampledImage);
  if (is_intf_obj == true) {
    if (ld_inst->opcode() != spv::Op::OpLoad) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst) << "Expect to see OpLoad";
    }
    int texture_id = ld_inst->GetOperandAs<int>(2);  // variable to load
    spv::Decoration decor = spv::Decoration::BlockMatchTextureQCOM;
    if (!_.HasDecoration(texture_id, decor)) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
             << "Missing decoration " << _.SpvDecorationString(decor);
    }
    decor = spv::Decoration::BlockMatchSamplerQCOM;
    if (!_.HasDecoration(texture_id, decor)) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
             << "Missing decoration " << _.SpvDecorationString(decor);
    }
  } else {
    const Instruction* si_inst = ld_inst;
    int t_idx = si_inst->GetOperandAs<int>(2);  // texture
    const Instruction* t_ld_inst = _.FindDef(t_idx);
    if (t_ld_inst->opcode() != spv::Op::OpLoad) {
      return _.diag(SPV_ERROR_INVALID_DATA, t_ld_inst)
             << "Expect to see OpLoad";
    }
    int texture_id = t_ld_inst->GetOperandAs<int>(2);  // variable to load
    spv::Decoration decor = spv::Decoration::BlockMatchTextureQCOM;
    if (!_.HasDecoration(texture_id, decor)) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
             << "Missing decoration " << _.SpvDecorationString(decor);
    }
    int s_idx = si_inst->GetOperandAs<int>(3);  // sampler
    const Instruction* s_ld_inst = _.FindDef(s_idx);
    if (s_ld_inst->opcode() != spv::Op::OpLoad) {
      return _.diag(SPV_ERROR_INVALID_DATA, s_ld_inst)
             << "Expect to see OpLoad";
    }
    int sampler_id = s_ld_inst->GetOperandAs<int>(2);  // variable to load
    decor = spv::Decoration::BlockMatchSamplerQCOM;
    if (!_.HasDecoration(sampler_id, decor)) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
             << "Missing decoration " << _.SpvDecorationString(decor);
    }
  }

  return SPV_SUCCESS;
}